

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::V0LayerParameter::InternalSerializeWithCachedSizesToArray
          (V0LayerParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  Type *value;
  uint8 *puVar4;
  UnknownFieldSet *unknown_fields;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.name");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar3 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.type");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (2,(this->type_).ptr_,target);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (3,this->num_output_,target);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(4,this->biasterm_,target);
  }
  if ((uVar1 & 0x20) != 0) {
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                       (5,this->weight_filler_,deterministic,target);
  }
  if ((uVar1 & 0x40) != 0) {
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                       (6,this->bias_filler_,deterministic,target);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7,this->pad_,target);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (8,this->kernelsize_,target);
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9,this->group_,target);
  }
  if ((uVar1 >> 0x19 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10,this->stride_,target)
    ;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xb,this->pool_,target);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0xc,this->dropout_ratio_,target);
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0xd,this->local_size_,target);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xe,this->alpha_,target);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xf,this->beta_,target);
  }
  if ((uVar1 & 4) != 0) {
    psVar3 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.source");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0x10,(this->source_).ptr_,target);
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x11,this->scale_,target)
    ;
  }
  if ((uVar1 & 8) != 0) {
    psVar3 = (this->meanfile_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.meanfile");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0x12,(this->meanfile_).ptr_,target);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x13,this->batchsize_,target);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x14,this->cropsize_,target);
  }
  if ((short)uVar1 < 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x15,this->mirror_,target)
    ;
  }
  if ((int)uVar1 < 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x16,this->k_,target);
  }
  iVar2 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&(this->blobs_).super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobProto>(0x32,value,deterministic,target)
    ;
  }
  puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                     (0x33,&this->blobs_lr_,target);
  puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                     (0x34,&this->weight_decay_,puVar4);
  if ((uVar1 >> 0x11 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x35,this->rand_skip_,puVar4);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x36,this->det_fg_threshold_,puVar4);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x37,this->det_bg_threshold_,puVar4);
  }
  if ((uVar1 & 4) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x38,this->det_fg_fraction_,puVar4);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 >> 0x12 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x3a,this->det_context_pad_,puVar4);
  }
  if ((uVar1 & 0x10) != 0) {
    psVar3 = (this->det_crop_mode_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.det_crop_mode");
    puVar4 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0x3b,(this->det_crop_mode_).ptr_,puVar4);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x3c,this->new_num_,puVar4);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x3d,this->new_channels_,puVar4);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x3e,this->new_height_,puVar4);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x3f,this->new_width_,puVar4);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x40,this->shuffle_images_,puVar4);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x41,this->concat_dim_,puVar4);
  }
  if ((char)uVar1 < '\0') {
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HDF5OutputParameter>
                       (0x3e9,this->hdf5_output_param_,deterministic,puVar4);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar4;
  }
  unknown_fields = V0LayerParameter::unknown_fields(this);
  puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar4);
  return puVar4;
}

Assistant:

::google::protobuf::uint8* V0LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V0LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->type(), target);
  }

  // optional uint32 num_output = 3;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3, this->num_output(), target);
  }

  // optional bool biasterm = 4 [default = true];
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(4, this->biasterm(), target);
  }

  // optional .caffe.FillerParameter weight_filler = 5;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 6;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, *this->bias_filler_, deterministic, target);
  }

  // optional uint32 pad = 7 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7, this->pad(), target);
  }

  // optional uint32 kernelsize = 8;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(8, this->kernelsize(), target);
  }

  // optional uint32 group = 9 [default = 1];
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->group(), target);
  }

  // optional uint32 stride = 10 [default = 1];
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->stride(), target);
  }

  // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      11, this->pool(), target);
  }

  // optional float dropout_ratio = 12 [default = 0.5];
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(12, this->dropout_ratio(), target);
  }

  // optional uint32 local_size = 13 [default = 5];
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(13, this->local_size(), target);
  }

  // optional float alpha = 14 [default = 1];
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(14, this->alpha(), target);
  }

  // optional float beta = 15 [default = 0.75];
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(15, this->beta(), target);
  }

  // optional string source = 16;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        16, this->source(), target);
  }

  // optional float scale = 17 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(17, this->scale(), target);
  }

  // optional string meanfile = 18;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->meanfile().data(), this->meanfile().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.meanfile");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        18, this->meanfile(), target);
  }

  // optional uint32 batchsize = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(19, this->batchsize(), target);
  }

  // optional uint32 cropsize = 20 [default = 0];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(20, this->cropsize(), target);
  }

  // optional bool mirror = 21 [default = false];
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(21, this->mirror(), target);
  }

  // optional float k = 22 [default = 1];
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(22, this->k(), target);
  }

  // repeated .caffe.BlobProto blobs = 50;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        50, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 51;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(51, this->blobs_lr_, target);

  // repeated float weight_decay = 52;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(52, this->weight_decay_, target);

  // optional uint32 rand_skip = 53 [default = 0];
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(53, this->rand_skip(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional float det_fg_threshold = 54 [default = 0.5];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(54, this->det_fg_threshold(), target);
  }

  // optional float det_bg_threshold = 55 [default = 0.5];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(55, this->det_bg_threshold(), target);
  }

  // optional float det_fg_fraction = 56 [default = 0.25];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(56, this->det_fg_fraction(), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional uint32 det_context_pad = 58 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(58, this->det_context_pad(), target);
  }

  // optional string det_crop_mode = 59 [default = "warp"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->det_crop_mode().data(), this->det_crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.det_crop_mode");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        59, this->det_crop_mode(), target);
  }

  // optional int32 new_num = 60 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(60, this->new_num(), target);
  }

  // optional int32 new_channels = 61 [default = 0];
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(61, this->new_channels(), target);
  }

  // optional int32 new_height = 62 [default = 0];
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(62, this->new_height(), target);
  }

  // optional int32 new_width = 63 [default = 0];
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(63, this->new_width(), target);
  }

  // optional bool shuffle_images = 64 [default = false];
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(64, this->shuffle_images(), target);
  }

  // optional uint32 concat_dim = 65 [default = 1];
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(65, this->concat_dim(), target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1001, *this->hdf5_output_param_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V0LayerParameter)
  return target;
}